

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O0

CPubKey * __thiscall CKey::GetPubKey(CKey *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  CPubKey *in_RDI;
  long in_FS_OFFSET;
  secp256k1_pubkey *unaff_retaddr;
  secp256k1_context *in_stack_00000008;
  int ret;
  size_t clen;
  secp256k1_pubkey pubkey;
  CKey *in_stack_ffffffffffffff78;
  secp256k1_context *this_00;
  uint in_stack_ffffffffffffffdc;
  secp256k1_pubkey *in_stack_ffffffffffffffe0;
  size_t *in_stack_ffffffffffffffe8;
  uchar *in_stack_fffffffffffffff0;
  secp256k1_context *ctx;
  
  ctx = *(secp256k1_context **)(in_FS_OFFSET + 0x28);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                      *)in_stack_ffffffffffffff78);
  if (!bVar1) {
    __assert_fail("keydata",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                  ,0xb7,"CPubKey CKey::GetPubKey() const");
  }
  CPubKey::CPubKey((CPubKey *)in_stack_ffffffffffffff78);
  begin(in_stack_ffffffffffffff78);
  UCharCast(&in_stack_ffffffffffffff78->fCompressed);
  iVar2 = secp256k1_ec_pubkey_create(in_stack_00000008,unaff_retaddr,(uchar *)ctx);
  if (iVar2 == 0) {
    __assert_fail("ret",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                  ,0xbc,"CPubKey CKey::GetPubKey() const");
  }
  this_00 = secp256k1_context_sign;
  CPubKey::begin((CPubKey *)secp256k1_context_sign);
  secp256k1_ec_pubkey_serialize
            (ctx,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
             in_stack_ffffffffffffffdc);
  uVar3 = CPubKey::size((CPubKey *)this_00);
  if (uVar3 != 0x41) {
    __assert_fail("result.size() == clen",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                  ,0xbe,"CPubKey CKey::GetPubKey() const");
  }
  bVar1 = CPubKey::IsValid((CPubKey *)this_00);
  if (bVar1) {
    if (*(secp256k1_context **)(in_FS_OFFSET + 0x28) == ctx) {
      return in_RDI;
    }
    __stack_chk_fail();
  }
  __assert_fail("result.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                ,0xbf,"CPubKey CKey::GetPubKey() const");
}

Assistant:

CPubKey CKey::GetPubKey() const {
    assert(keydata);
    secp256k1_pubkey pubkey;
    size_t clen = CPubKey::SIZE;
    CPubKey result;
    int ret = secp256k1_ec_pubkey_create(secp256k1_context_sign, &pubkey, UCharCast(begin()));
    assert(ret);
    secp256k1_ec_pubkey_serialize(secp256k1_context_sign, (unsigned char*)result.begin(), &clen, &pubkey, fCompressed ? SECP256K1_EC_COMPRESSED : SECP256K1_EC_UNCOMPRESSED);
    assert(result.size() == clen);
    assert(result.IsValid());
    return result;
}